

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

DUMB_IT_SIGRENDERER *
dup_sigrenderer(DUMB_IT_SIGRENDERER *src,int n_channels,IT_CALLBACKS *callbacks)

{
  IT_PLAYING *pIVar1;
  void *pvVar2;
  IT_CALLBACKS *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  int i;
  DUMB_IT_SIGRENDERER *dst;
  IT_CHANNEL *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  DUMB_IT_SIGRENDERER *local_8;
  
  if (in_RDI == (undefined8 *)0x0) {
    if (in_RDX != (IT_CALLBACKS *)0x0) {
      free(in_RDX);
    }
    local_8 = (DUMB_IT_SIGRENDERER *)0x0;
  }
  else {
    local_8 = (DUMB_IT_SIGRENDERER *)malloc(0x2e98);
    if (local_8 == (DUMB_IT_SIGRENDERER *)0x0) {
      if (in_RDX != (IT_CALLBACKS *)0x0) {
        free(in_RDX);
      }
      local_8 = (DUMB_IT_SIGRENDERER *)0x0;
    }
    else {
      local_8->free_playing = (IT_PLAYING *)0x0;
      local_8->sigdata = (DUMB_IT_SIGDATA *)*in_RDI;
      local_8->n_channels = in_ESI;
      local_8->resampling_quality = *(int *)((long)in_RDI + 0xc);
      local_8->globalvolume = *(uchar *)(in_RDI + 2);
      local_8->globalvolslide = *(char *)((long)in_RDI + 0x11);
      local_8->tempo = *(int *)((long)in_RDI + 0x14);
      local_8->temposlide = *(char *)(in_RDI + 3);
      for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 1) {
        dup_channel((IT_CHANNEL *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
      }
      for (iVar3 = 0; iVar3 < 0xc0; iVar3 = iVar3 + 1) {
        pIVar1 = dup_playing((IT_PLAYING *)local_8,
                             (IT_CHANNEL *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8);
        local_8->playing[iVar3] = pIVar1;
      }
      local_8->tick = *(int *)(in_RDI + 0x5c4);
      local_8->speed = *(int *)((long)in_RDI + 0x2e24);
      local_8->rowcount = *(int *)(in_RDI + 0x5c5);
      local_8->order = *(int *)((long)in_RDI + 0x2e2c);
      local_8->row = *(int *)(in_RDI + 0x5c6);
      local_8->processorder = *(int *)((long)in_RDI + 0x2e34);
      local_8->processrow = *(int *)(in_RDI + 0x5c7);
      local_8->breakrow = *(int *)((long)in_RDI + 0x2e3c);
      local_8->restart_position = *(int *)(in_RDI + 0x5c8);
      local_8->n_rows = *(int *)((long)in_RDI + 0x2e44);
      local_8->entry_start = (IT_ENTRY *)in_RDI[0x5c9];
      local_8->entry = (IT_ENTRY *)in_RDI[0x5ca];
      local_8->entry_end = (IT_ENTRY *)in_RDI[0x5cb];
      local_8->time_left = *(int32 *)(in_RDI + 0x5cc);
      local_8->sub_time_left = *(int *)((long)in_RDI + 0x2e64);
      local_8->ramp_style = *(int *)(in_RDI + 0x5d1);
      local_8->click_remover = (DUMB_CLICK_REMOVER **)0x0;
      local_8->callbacks = in_RDX;
      pvVar2 = bit_array_dup(local_8);
      local_8->played = pvVar2;
      local_8->gvz_time = *(int32 *)(in_RDI + 0x5d0);
      local_8->gvz_sub_time = *(int *)((long)in_RDI + 0x2e84);
    }
  }
  return local_8;
}

Assistant:

static DUMB_IT_SIGRENDERER *dup_sigrenderer(DUMB_IT_SIGRENDERER *src, int n_channels, IT_CALLBACKS *callbacks)
{
	DUMB_IT_SIGRENDERER *dst;
	int i;

	if (!src) {
		if (callbacks) free(callbacks);
		return NULL;
	}

	dst = malloc(sizeof(*dst));
	if (!dst) {
		if (callbacks) free(callbacks);
		return NULL;
	}

	dst->free_playing = NULL;
	dst->sigdata = src->sigdata;

	dst->n_channels = n_channels;

	dst->resampling_quality = src->resampling_quality;

	dst->globalvolume = src->globalvolume;
	dst->globalvolslide = src->globalvolslide;

	dst->tempo = src->tempo;
	dst->temposlide = src->temposlide;

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++)
		dup_channel(&dst->channel[i], &src->channel[i]);

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++)
		dst->playing[i] = dup_playing(src->playing[i], dst->channel, src->channel);

	dst->tick = src->tick;
	dst->speed = src->speed;
	dst->rowcount = src->rowcount;

	dst->order = src->order;
	dst->row = src->row;
	dst->processorder = src->processorder;
	dst->processrow = src->processrow;
	dst->breakrow = src->breakrow;

	dst->restart_position = src->restart_position;

	dst->n_rows = src->n_rows;

	dst->entry_start = src->entry_start;
	dst->entry = src->entry;
	dst->entry_end = src->entry_end;

	dst->time_left = src->time_left;
	dst->sub_time_left = src->sub_time_left;

	dst->ramp_style = src->ramp_style;

	dst->click_remover = NULL;

	dst->callbacks = callbacks;

#ifdef BIT_ARRAY_BULLSHIT
	dst->played = bit_array_dup(src->played);
#endif

	dst->gvz_time = src->gvz_time;
	dst->gvz_sub_time = src->gvz_sub_time;

	//dst->max_output = src->max_output;

	return dst;
}